

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void array_suite::test_empty(void)

{
  bool bVar1;
  undefined4 uVar2;
  char input [3];
  reader reader;
  uint local_174;
  view_type local_170;
  char local_15c [4];
  basic_reader<char> local_158;
  
  local_15c[2] = 0;
  local_15c[0] = '[';
  local_15c[1] = ']';
  local_170._M_len = strlen(local_15c);
  local_170._M_str = local_15c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x12a,"void array_suite::test_empty()",&local_170,&local_174);
  local_170._M_len._0_4_ = trial::protocol::json::basic_reader<char>::symbol(&local_158);
  local_174 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,299,"void array_suite::test_empty()",&local_170,&local_174);
  uVar2 = 0;
  if ((uint)(local_158.decoder.current.code + error_unbalanced_end_array) < 0xb) {
    uVar2 = *(undefined4 *)
             (&DAT_0011f510 +
             (ulong)(uint)(local_158.decoder.current.code + error_unbalanced_end_array) * 4);
  }
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,uVar2);
  local_174 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::structural",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,300,"void array_suite::test_empty()",&local_170,&local_174);
  if ((long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_170._M_len =
         ((long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    local_174 = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("reader.level()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x12d,"void array_suite::test_empty()",&local_170,&local_174);
    bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
    local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
    local_174 = CONCAT31(local_174._1_3_,1);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
              ("reader.next()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x12e,"void array_suite::test_empty()",&local_170,&local_174);
    local_174 = 0xd;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
              ("reader.code()","token::code::end_array",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x12f,"void array_suite::test_empty()",&local_170,&local_174);
    local_170._M_len._0_4_ = trial::protocol::json::basic_reader<char>::symbol(&local_158);
    local_174 = 9;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
              ("reader.symbol()","token::symbol::end_array",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x130,"void array_suite::test_empty()",&local_170,&local_174);
    uVar2 = 0;
    if ((uint)(local_158.decoder.current.code + error_unbalanced_end_array) < 0xb) {
      uVar2 = *(undefined4 *)
               (&DAT_0011f510 +
               (ulong)(uint)(local_158.decoder.current.code + error_unbalanced_end_array) * 4);
    }
    local_170._M_len = CONCAT44(local_170._M_len._4_4_,uVar2);
    local_174 = 3;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
              ("reader.category()","token::category::structural",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x131,"void array_suite::test_empty()",&local_170,&local_174);
    if ((long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_170._M_len =
           ((long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
      local_174 = 0;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                ("reader.level()","0",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x132,"void array_suite::test_empty()",&local_170,&local_174);
      bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
      local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
      local_174 = local_174 & 0xffffff00;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                ("reader.next()","false",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x133,"void array_suite::test_empty()",&local_170,&local_174);
      local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
      local_174 = 0;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                ("reader.code()","token::code::end",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x134,"void array_suite::test_empty()",&local_170,&local_174);
      if ((long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        local_170._M_len =
             ((long)local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
        local_174 = 0;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                  ("reader.level()","0",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x135,"void array_suite::test_empty()",&local_170,&local_174);
        if (local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_158.stack.c.
                                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.stack.c.
                                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
    }
  }
  __assert_fail("stack.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/json/detail/reader.ipp"
                ,0x107,
                "size_type trial::protocol::json::basic_reader<char>::level() const [CharT = char]")
  ;
}

Assistant:

void test_empty()
{
    const char input[] = "[]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::structural);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::structural);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
}